

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O2

void MoveOut(Heap *heap,Chuck *chuck)

{
  ChuckLayout *pCVar1;
  Chuck *pCVar2;
  byte bVar3;
  byte bVar4;
  ChuckLayout *pCVar5;
  Size size;
  
  pCVar5 = chuck->prev;
  pCVar1 = chuck->next;
  if (pCVar5 == (ChuckLayout *)0x0) {
    pCVar5 = (ChuckLayout *)0x0;
    if (pCVar1 == (ChuckLayout *)0x0) goto LAB_001029c1;
  }
  else {
    pCVar5->next = pCVar1;
    if (pCVar1 == (ChuckLayout *)0x0) {
      pCVar5 = (ChuckLayout *)0x0;
      goto LAB_001029c1;
    }
  }
  pCVar1->prev = pCVar5;
  pCVar5 = pCVar1;
LAB_001029c1:
  pCVar2 = heap->head;
  if (pCVar2 == heap->last) {
    if (pCVar2 != chuck) {
      __assert_fail("chuck == heap->head",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                    ,0x116,"void MoveOut(Heap *, Chuck *)");
    }
    heap->head = (Chuck *)0x0;
    heap->last = (Chuck *)0x0;
  }
  else {
    if (pCVar2 == chuck) {
      heap->head = pCVar5;
    }
    if (heap->last == chuck) {
      heap->last = chuck->prev;
    }
  }
  size = (ulong)(*(uint *)&chuck->field_0x4 & 0xfffffffe) << 2;
  if (*(uint *)&chuck->field_0x4 < 0x86) {
    bVar3 = MatchExact(size);
    if (heap->exact[bVar3] == chuck) {
      pCVar5 = chuck->next;
      if ((pCVar5 == (ChuckLayout *)0x0) ||
         (1 < (*(uint *)&chuck->field_0x4 ^ *(uint *)&pCVar5->field_0x4))) {
        heap->exact[bVar3] = (Chuck *)0x0;
      }
      else {
        heap->exact[bVar3] = pCVar5;
      }
    }
  }
  else {
    bVar3 = MatchSorted(size);
    if (heap->sorted[bVar3] == chuck) {
      if ((chuck->next != (ChuckLayout *)0x0) &&
         (bVar4 = MatchSorted((ulong)(*(uint *)&chuck->next->field_0x4 & 0xfffffffe) << 2),
         bVar4 == bVar3)) {
        heap->sorted[bVar3] = chuck->next;
        return;
      }
      heap->sorted[bVar3] = (Chuck *)0x0;
    }
  }
  return;
}

Assistant:

static void MoveOut(Heap *heap, Chuck *chuck) {
    if (chuck->prev) {
        SetNext(chuck->prev, chuck->next);
    } else if (chuck->next) {
        SetPrev(chuck->next, chuck->prev);
    }

    if (heap->head == heap->last) {
        assert(chuck == heap->head);
        heap->head = heap->last = NULL;
    } else {
        if (chuck == heap->head) {
            heap->head = chuck->next;
        }
        if (chuck == heap->last) {
            heap->last = chuck->prev;
        }
    }

    if (GetSize(chuck) < NOT_EXACT_MIN) {
        uint8_t slot = MatchExact(GetSize(chuck));
        if (heap->exact[slot] == chuck) {
            if (!chuck->next || GetSize(chuck->next) != GetSize(chuck)) {
                heap->exact[slot] = NULL;
            } else {
                heap->exact[slot] = chuck->next;
            }
        }
    } else {
        uint8_t slot = MatchSorted(GetSize(chuck));
        if (heap->sorted[slot] == chuck) {
            if (!chuck->next || MatchSorted(GetSize((chuck->next))) != slot) {
                heap->sorted[slot] = NULL;
            } else {
                heap->sorted[slot] = chuck->next;
            }
        }
    }
}